

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O3

errr Term_xtra_x11(wchar_t n,wchar_t v)

{
  uint8_t uVar1;
  uint8_t blue;
  void *pvVar2;
  undefined8 *puVar3;
  ulong uVar4;
  errr eVar5;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint8_t red;
  int iVar10;
  long lVar11;
  _Bool wait;
  undefined1 local_a0 [8];
  ulong local_98;
  
  eVar5 = 1;
  switch(n) {
  case L'\x01':
    wait = v != L'\0';
    goto LAB_0012511d;
  case L'\x02':
    do {
      eVar5 = CheckEvent(false);
    } while (eVar5 == 0);
    return 0;
  case L'\x03':
    XClearWindow(metadpy_default_0,Infowin->win);
    break;
  default:
    goto switchD_001250f4_caseD_4;
  case L'\x06':
    XFlush(metadpy_default_0);
    break;
  case L'\a':
    XBell(metadpy_default_0,100);
    break;
  case L'\t':
    wait = false;
LAB_0012511d:
    eVar5 = CheckEvent(wait);
    return eVar5;
  case L'\n':
    if ((metadpy_default_16 & 2) == 0) {
      return 0;
    }
    lVar11 = 0;
    do {
      if (color_table_x11[lVar11][0] == angband_color_table[lVar11][0]) {
        uVar1 = color_table_x11[lVar11][1];
        red = angband_color_table[lVar11][1];
        if (((uVar1 != angband_color_table[lVar11][1]) ||
            (red = uVar1, color_table_x11[lVar11][2] != angband_color_table[lVar11][2])) ||
           (color_table_x11[lVar11][3] != angband_color_table[lVar11][3])) goto LAB_001251aa;
      }
      else {
        red = angband_color_table[lVar11][1];
LAB_001251aa:
        color_table_x11[lVar11][0] = angband_color_table[lVar11][0];
        color_table_x11[lVar11][1] = red;
        uVar1 = angband_color_table[lVar11][2];
        color_table_x11[lVar11][2] = uVar1;
        blue = angband_color_table[lVar11][3];
        color_table_x11[lVar11][3] = blue;
        uVar6 = create_pixel(metadpy_default_0,red,uVar1,blue);
        uVar8 = (ulong)uVar6;
        Infoclr = clr[lVar11];
        if (uVar8 <= metadpy_default_15) {
          XSetForeground(metadpy_default_0,Infoclr->gc,uVar8);
        }
        iVar10 = (int)lVar11;
        if (iVar10 == 0) {
          lVar9 = 0;
          uVar7 = metadpy_default_15;
          metadpy_default_13 = uVar8;
          do {
            Infoclr = *(infoclr **)((long)clr + lVar9);
            if (uVar8 <= uVar7) {
              XSetBackground(metadpy_default_0,Infoclr->gc,uVar8);
              uVar7 = metadpy_default_15;
            }
            lVar9 = lVar9 + 8;
            uVar4 = metadpy_default_14;
          } while (lVar9 != 0x100);
        }
        else {
          uVar4 = uVar8;
          if ((iVar10 != 1) && (uVar4 = metadpy_default_14, iVar10 == 0x1c)) {
            lVar9 = 0;
            uVar7 = metadpy_default_15;
            do {
              Infoclr = clr[lVar9 + 0x40];
              if (uVar8 <= uVar7) {
                XSetBackground(metadpy_default_0,Infoclr->gc,uVar8);
                uVar7 = metadpy_default_15;
              }
              lVar9 = lVar9 + 1;
              uVar4 = metadpy_default_14;
            } while (lVar9 != 0x20);
          }
        }
        metadpy_default_14 = uVar4;
        Infoclr = clr[lVar11 + 0x20];
        if (uVar8 <= metadpy_default_15) {
          XSetForeground(metadpy_default_0,Infoclr->gc,uVar8);
        }
        if (uVar8 <= metadpy_default_15) {
          XSetBackground(metadpy_default_0,Infoclr->gc,uVar8);
        }
        Infoclr = clr[lVar11 + 0x40];
        if (uVar8 <= metadpy_default_15) {
          XSetForeground(metadpy_default_0,Infoclr->gc,uVar8);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x20);
    local_98 = metadpy_default_13;
    lVar11 = 0;
    do {
      if (((angband_term[lVar11] != (term *)0x0) &&
          (pvVar2 = angband_term[lVar11]->data, pvVar2 != (void *)0x0)) &&
         (puVar3 = *(undefined8 **)((long)pvVar2 + 0xe0), puVar3 != (undefined8 *)0x0)) {
        XChangeWindowAttributes(metadpy_default_0,*puVar3,2,local_a0);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 8);
    break;
  case L'\f':
    if (v == L'\0') {
      return 0;
    }
    Infowin = *(infowin **)((long)Term->data + 0xe0);
    Infofnt = *(infofnt **)((long)Term->data + 0xd8);
    return 0;
  case L'\r':
    eVar5 = 0;
    if (L'\0' < v) {
      usleep(v * 1000);
      eVar5 = 0;
    }
    goto switchD_001250f4_caseD_4;
  }
  eVar5 = 0;
switchD_001250f4_caseD_4:
  return eVar5;
}

Assistant:

static errr Term_xtra_x11(int n, int v)
{
	/* Handle a subset of the legal requests */
	switch (n)
	{
		/* Make a noise */
		case TERM_XTRA_NOISE: Metadpy_do_beep(); return (0);

		/* Flush the output XXX XXX */
		case TERM_XTRA_FRESH: Metadpy_update(1, 0, 0); return (0);

		/* Process random events XXX */
		case TERM_XTRA_BORED: return (CheckEvent(0));

		/* Process Events XXX */
		case TERM_XTRA_EVENT: return (CheckEvent(v));

		/* Flush the events XXX */
		case TERM_XTRA_FLUSH: while (!CheckEvent(false)); return (0);

		/* Handle change in the "level" */
		case TERM_XTRA_LEVEL: return (Term_xtra_x11_level(v));

		/* Clear the screen */
		case TERM_XTRA_CLEAR: Infowin_wipe(); return (0);

		/* Delay for some milliseconds */
		case TERM_XTRA_DELAY:
			if (v > 0) usleep(1000 * v);
			return (0);

		/* React to changes */
		case TERM_XTRA_REACT: return (Term_xtra_x11_react());
	}

	/* Unknown */
	return (1);
}